

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

bool __thiscall kj::_::NetworkFilter::shouldAllow(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  CidrRange *pCVar6;
  NetworkFilter *pNVar7;
  sockaddr *in_RCX;
  ArrayPtr<const_kj::CidrRange> cidrs;
  ArrayPtr<const_kj::CidrRange> cidrs_00;
  ArrayPtr<const_kj::CidrRange> cidrs_01;
  ArrayPtr<const_kj::CidrRange> cidrs_02;
  ArrayPtr<const_kj::CidrRange> cidrs_03;
  NetworkFilter *n;
  NetworkFilter *_n3177;
  CidrRange *cidr_1;
  CidrRange *__end2_1;
  CidrRange *__begin2_1;
  Vector<kj::CidrRange> *__range2_1;
  CidrRange *local_100;
  CidrRange *cidr;
  CidrRange *__end2;
  CidrRange *__begin2;
  Vector<kj::CidrRange> *__range2;
  CidrRange *local_d8;
  ArrayPtr<const_kj::CidrRange> local_d0;
  ArrayPtr<const_kj::CidrRange> local_c0;
  ArrayPtr<const_kj::CidrRange> local_b0;
  ArrayPtr<const_kj::CidrRange> local_a0;
  uint local_90;
  byte local_89;
  uint allowSpecificity;
  bool allowed;
  ArrayPtr<const_char> path;
  Fault local_68;
  Fault f;
  uint *local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  uint addrlen_local;
  sockaddr *addr_local;
  NetworkFilter *this_local;
  
  _kjCondition._36_4_ = addrlen;
  local_58 = (uint *)DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                                (uint *)&_kjCondition.field_0x24);
  f.exception = (Exception *)0x2;
  DebugExpression<unsigned_int&>::operator>=
            ((DebugComparison<unsigned_int_&,_unsigned_long> *)local_50,
             (DebugExpression<unsigned_int&> *)&local_58,(unsigned_long *)&f);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xc39,FAILED,"addrlen >= sizeof(addr->sa_family)","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_long> *)local_50);
    Debug::Fault::fatal(&local_68);
  }
  if (addr->sa_family == 1) {
    _allowSpecificity = safeUnixPath((sockaddr_un *)addr,_kjCondition._36_4_);
    sVar4 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&allowSpecificity);
    if ((sVar4 == 0) ||
       (pcVar5 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&allowSpecificity,0),
       *pcVar5 != '\0')) {
      this_local._7_1_ = (bool)(this->allowUnix & 1);
    }
    else {
      this_local._7_1_ = (bool)(this->allowAbstractUnix & 1);
    }
  }
  else {
    local_89 = 0;
    local_90 = 0;
    if (((this->allowPublic & 1U) != 0) && ((addr->sa_family == 2 || (addr->sa_family == 10)))) {
      local_a0 = privateCidrs();
      cidrs.size_ = (size_t)addr;
      cidrs.ptr = (CidrRange *)local_a0.size_;
      bVar1 = matchesAny((_ *)local_a0.ptr,cidrs,in_RCX);
      if (!bVar1) {
        local_b0 = localCidrs();
        cidrs_00.size_ = (size_t)addr;
        cidrs_00.ptr = (CidrRange *)local_b0.size_;
        bVar1 = matchesAny((_ *)local_b0.ptr,cidrs_00,in_RCX);
        if (!bVar1) {
          local_c0 = reservedCidrs();
          cidrs_01.size_ = (size_t)addr;
          cidrs_01.ptr = (CidrRange *)local_c0.size_;
          bVar1 = matchesAny((_ *)local_c0.ptr,cidrs_01,in_RCX);
          if (!bVar1) {
            local_89 = 1;
          }
        }
      }
    }
    if (((this->allowNetwork & 1U) != 0) && ((addr->sa_family == 2 || (addr->sa_family == 10)))) {
      local_d0 = localCidrs();
      cidrs_02.size_ = (size_t)addr;
      cidrs_02.ptr = (CidrRange *)local_d0.size_;
      bVar1 = matchesAny((_ *)local_d0.ptr,cidrs_02,in_RCX);
      if (!bVar1) {
        ___range2 = reservedCidrs();
        cidrs_03.size_ = (size_t)addr;
        cidrs_03.ptr = local_d8;
        bVar1 = matchesAny((_ *)__range2,cidrs_03,in_RCX);
        if (!bVar1) {
          local_89 = 1;
        }
      }
    }
    __begin2 = (CidrRange *)&this->allowCidrs;
    __end2 = Vector<kj::CidrRange>::begin((Vector<kj::CidrRange> *)__begin2);
    cidr = Vector<kj::CidrRange>::end((Vector<kj::CidrRange> *)__begin2);
    for (; __end2 != cidr; __end2 = __end2 + 1) {
      local_100 = __end2;
      bVar1 = CidrRange::matches(__end2,addr);
      if (bVar1) {
        __range2_1._4_4_ = CidrRange::getSpecificity(local_100);
        local_90 = max<unsigned_int&,unsigned_int>(&local_90,(uint *)((long)&__range2_1 + 4));
        local_89 = 1;
      }
    }
    if ((local_89 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      __end2_1 = Vector<kj::CidrRange>::begin(&this->denyCidrs);
      pCVar6 = Vector<kj::CidrRange>::end(&this->denyCidrs);
      for (; __end2_1 != pCVar6; __end2_1 = __end2_1 + 1) {
        bVar1 = CidrRange::matches(__end2_1,addr);
        if ((bVar1) && (uVar2 = CidrRange::getSpecificity(__end2_1), local_90 <= uVar2)) {
          return false;
        }
      }
      pNVar7 = readMaybe<kj::_::NetworkFilter>(&this->next);
      if (pNVar7 == (NetworkFilter *)0x0) {
        this_local._7_1_ = true;
      }
      else {
        iVar3 = (**(pNVar7->super_NetworkFilter)._vptr_NetworkFilter)
                          (pNVar7,addr,(ulong)(uint)_kjCondition._36_4_);
        this_local._7_1_ = (bool)((byte)iVar3 & 1);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool NetworkFilter::shouldAllow(const struct sockaddr* addr, uint addrlen) {
  KJ_REQUIRE(addrlen >= sizeof(addr->sa_family));

#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      return allowAbstractUnix;
    } else {
      return allowUnix;
    }
  }
#endif

  bool allowed = false;
  uint allowSpecificity = 0;

  if (allowPublic) {
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        !matchesAny(privateCidrs(), addr) &&
        !matchesAny(localCidrs(), addr) &&
        !matchesAny(reservedCidrs(), addr)) {
      allowed = true;
      // Don't adjust allowSpecificity as this match has an effective specificity of zero.
    }
  }

  if (allowNetwork) {
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        !matchesAny(localCidrs(), addr) &&
        !matchesAny(reservedCidrs(), addr)) {
      allowed = true;
      // Don't adjust allowSpecificity as this match has an effective specificity of zero.
    }
  }

  for (auto& cidr: allowCidrs) {
    if (cidr.matches(addr)) {
      allowSpecificity = kj::max(allowSpecificity, cidr.getSpecificity());
      allowed = true;
    }
  }
  if (!allowed) return false;
  for (auto& cidr: denyCidrs) {
    if (cidr.matches(addr)) {
      if (cidr.getSpecificity() >= allowSpecificity) return false;
    }
  }

  KJ_IF_SOME(n, next) {
    return n.shouldAllow(addr, addrlen);
  } else {
    return true;
  }
}